

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O0

char * i2s_ASN1_ENUMERATED(X509V3_EXT_METHOD *meth,ASN1_ENUMERATED *aint)

{
  BIGNUM *a;
  X509V3_EXT_METHOD *local_30;
  char *strtmp;
  BIGNUM *bntmp;
  ASN1_ENUMERATED *a_local;
  X509V3_EXT_METHOD *method_local;
  
  local_30 = (X509V3_EXT_METHOD *)0x0;
  if (aint == (ASN1_ENUMERATED *)0x0) {
    method_local = (X509V3_EXT_METHOD *)0x0;
  }
  else {
    a = ASN1_ENUMERATED_to_BN(aint,(BIGNUM *)0x0);
    if (a != (BIGNUM *)0x0) {
      local_30 = (X509V3_EXT_METHOD *)bignum_to_string((BIGNUM *)a);
    }
    BN_free(a);
    method_local = local_30;
  }
  return (char *)method_local;
}

Assistant:

char *i2s_ASN1_ENUMERATED(const X509V3_EXT_METHOD *method,
                          const ASN1_ENUMERATED *a) {
  BIGNUM *bntmp = NULL;
  char *strtmp = NULL;
  if (!a) {
    return NULL;
  }
  if (!(bntmp = ASN1_ENUMERATED_to_BN(a, NULL)) ||
      !(strtmp = bignum_to_string(bntmp))) {
  }
  BN_free(bntmp);
  return strtmp;
}